

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall deqp::gls::TextureRenderer::render(TextureRenderer *this,deUint32 texture)

{
  GLenum GVar1;
  GLuint index;
  GLint location;
  TestError *this_00;
  
  glwUseProgram((this->m_program->m_program).m_program);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glUseProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0xe1);
  index = glwGetAttribLocation((this->m_program->m_program).m_program,"a_coord");
  GVar1 = glwGetError();
  glu::checkError(GVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0xe4);
  if (index == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"coordLoc != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
               ,0xe5);
  }
  else {
    if (this->m_vao != 0) {
      glwBindVertexArray(this->m_vao);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindVertexArray(m_vao)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xe8);
    }
    glwEnableVertexAttribArray(index);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(coordLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xea);
    glwBindBuffer(0x8892,this->m_coordBuffer);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xec);
    glwVertexAttribPointer(index,2,0x1406,'\0',0,(void *)0x0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xed);
    glwActiveTexture(0x84c0);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glActiveTexture(GL_TEXTURE0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xef);
    glwBindTexture(0xde1,texture);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glBindTexture(GL_TEXTURE_2D, texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xf0);
    location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_texture");
    GVar1 = glwGetError();
    glu::checkError(GVar1,(char *)0x0,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0xf3);
    if (location != -1) {
      glwUniform1i(location,0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glUniform1i(texLoc, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xf6);
      glwBindBuffer(0x8893,this->m_indexBuffer);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xf8);
      glwDrawElements(4,6,0x1401,(void *)0x0);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xf9);
      glwDisableVertexAttribArray(index);
      GVar1 = glwGetError();
      glu::checkError(GVar1,"glDisableVertexAttribArray(coordLoc)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                      ,0xfb);
      if (this->m_vao != 0) {
        glwBindVertexArray(0);
        GVar1 = glwGetError();
        glu::checkError(GVar1,"glBindVertexArray(0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                        ,0xfe);
        return;
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"texLoc != (deUint32)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
               ,0xf4);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureRenderer::render (deUint32 texture)
{
	deUint32 coordLoc = -1;
	deUint32 texLoc	= -1;

	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));

	coordLoc = glGetAttribLocation(m_program->getProgram(), "a_coord");
	GLU_CHECK();
	TCU_CHECK(coordLoc != (deUint32)-1);

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(m_vao));

	GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL));

	GLU_CHECK_CALL(glActiveTexture(GL_TEXTURE0));
	GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, texture));

	texLoc = glGetUniformLocation(m_program->getProgram(), "u_texture");
	GLU_CHECK();
	TCU_CHECK(texLoc != (deUint32)-1);

	GLU_CHECK_CALL(glUniform1i(texLoc, 0));

	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL));

	GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(0));
}